

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O0

int mbedtls_asn1_write_mpi(uchar **p,uchar *start,mbedtls_mpi *X)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  size_t local_38;
  size_t len;
  int ret;
  mbedtls_mpi *X_local;
  uchar *start_local;
  uchar **p_local;
  
  local_38 = mbedtls_mpi_size(X);
  if ((*p < start) || ((ulong)((long)*p - (long)start) < local_38)) {
    return -0x6c;
  }
  *p = *p + -local_38;
  len._4_4_ = mbedtls_mpi_write_binary(X,*p,local_38);
  if (len._4_4_ == 0) {
    if ((X->s == 1) && ((**p & 0x80) != 0)) {
      if ((long)*p - (long)start < 1) {
        return -0x6c;
      }
      puVar1 = *p;
      *p = puVar1 + -1;
      puVar1[-1] = '\0';
      local_38 = local_38 + 1;
    }
    iVar2 = mbedtls_asn1_write_len(p,start,local_38);
    if (iVar2 < 0) {
      return iVar2;
    }
    iVar3 = mbedtls_asn1_write_tag(p,start,'\x02');
    if (iVar3 < 0) {
      return iVar3;
    }
    len._4_4_ = iVar3 + iVar2 + (int)local_38;
  }
  return len._4_4_;
}

Assistant:

int mbedtls_asn1_write_mpi( unsigned char **p, unsigned char *start, const mbedtls_mpi *X )
{
    int ret;
    size_t len = 0;

    // Write the MPI
    //
    len = mbedtls_mpi_size( X );

    if( *p < start || (size_t)( *p - start ) < len )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    (*p) -= len;
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( X, *p, len ) );

    // DER format assumes 2s complement for numbers, so the leftmost bit
    // should be 0 for positive numbers and 1 for negative numbers.
    //
    if( X->s ==1 && **p & 0x80 )
    {
        if( *p - start < 1 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

        *--(*p) = 0x00;
        len += 1;
    }

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_INTEGER ) );

    ret = (int) len;

cleanup:
    return( ret );
}